

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void __thiscall boost::detail::thread_data_base::~thread_data_base(thread_data_base *this)

{
  bool bVar1;
  iterator this_00;
  iterator this_01;
  condition_variable *in_RDI;
  iterator e_1;
  iterator i_1;
  iterator e;
  iterator i;
  mutex *in_stack_ffffffffffffffc8;
  __normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
  in_stack_ffffffffffffffe0;
  
  (in_RDI->internal_mutex).__align = (long)&PTR__thread_data_base_00305548;
  this_00 = std::
            vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
            ::begin((vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ::end((vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
         *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
    ::operator->((__normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
                  *)&stack0xfffffffffffffff0);
    mutex::unlock((mutex *)in_RDI);
    __gnu_cxx::
    __normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
    ::operator->((__normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
                  *)&stack0xfffffffffffffff0);
    condition_variable::notify_all((condition_variable *)in_stack_ffffffffffffffe0._M_current);
    __gnu_cxx::
    __normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
    ::operator++((__normal_iterator<std::pair<boost::condition_variable_*,_boost::mutex_*>_*,_std::vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  this_01 = std::
            vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
            ::begin((vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::
  vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ::end((vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
         *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
    ::operator*((__normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
                 *)&stack0xffffffffffffffe0);
    shared_ptr<boost::detail::shared_state_base>::operator->
              ((shared_ptr<boost::detail::shared_state_base> *)in_RDI);
    shared_state_base::notify_deferred((shared_state_base *)this_00._M_current);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
    ::operator++((__normal_iterator<boost::shared_ptr<boost::detail::shared_state_base>_*,_std::vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  std::
  vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ::~vector((vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
             *)this_01._M_current);
  std::
  vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ::~vector((vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
             *)this_01._M_current);
  std::
  map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
  ::~map((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
          *)0x2a2d2e);
  condition_variable::~condition_variable(in_RDI);
  mutex::~mutex(in_stack_ffffffffffffffc8);
  condition_variable::~condition_variable(in_RDI);
  mutex::~mutex(in_stack_ffffffffffffffc8);
  shared_ptr<boost::detail::thread_data_base>::~shared_ptr
            ((shared_ptr<boost::detail::thread_data_base> *)0x2a2d7a);
  enable_shared_from_this<boost::detail::thread_data_base>::~enable_shared_from_this
            ((enable_shared_from_this<boost::detail::thread_data_base> *)0x2a2d88);
  return;
}

Assistant:

thread_data_base::~thread_data_base()
        {
            for (notify_list_t::iterator i = notify.begin(), e = notify.end();
                    i != e; ++i)
            {
                i->second->unlock();
                i->first->notify_all();
            }
            for (async_states_t::iterator i = async_states_.begin(), e = async_states_.end();
                    i != e; ++i)
            {
                (*i)->notify_deferred();
            }
        }